

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O1

string * __thiscall
duckdb::CreateTreeRecursive_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,RenderTree *root,idx_t x,idx_t y)

{
  pointer pcVar1;
  pointer pCVar2;
  _Alloc_hider _Var3;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **__dest;
  pointer ppVar5;
  pointer params;
  pointer ppVar6;
  pointer pCVar7;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  size_type __dnew;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  items;
  string grid_item_format;
  string content;
  string title;
  string local_230;
  string local_210;
  optional_ptr<duckdb::RenderTreeNode,_true> local_1f0;
  RenderTree *local_1e8;
  pointer local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168 [2];
  pointer *local_158;
  pointer local_150;
  pointer local_148 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  RenderTree *local_130;
  idx_t local_128;
  RenderTreeNode *local_120;
  pointer local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  local_138 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_138;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1e8 = (RenderTree *)this;
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_178._M_allocated_capacity = (size_type)local_168;
  local_210._M_dataplus._M_p = (pointer)0x5a;
  __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)::std::__cxx11::string::_M_create(&local_178._M_allocated_capacity,(ulong)&local_210)
  ;
  _Var3._M_p = local_210._M_dataplus._M_p;
  local_168[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_210._M_dataplus._M_p;
  local_178._M_allocated_capacity = (size_type)__dest;
  switchD_01602a8a::default
            (__dest,
             "\n        <div class=\"tf-nc\">\n            <div class=\"title\">%s</div>%s\n        </div>\n    "
             ,0x5a);
  local_178._8_8_ = _Var3._M_p;
  *(char *)((long)__dest + (long)_Var3._M_p) = '\0';
  local_1f0 = RenderTree::GetNode(local_1e8,(idx_t)root,x);
  if (local_1f0.ptr == (RenderTreeNode *)0x0) {
    local_90._M_allocated_capacity = (size_type)&local_80;
    local_90._8_8_ = 0;
    local_80._M_local_buf[0] = '\0';
  }
  else {
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_1f0);
    local_f0 = local_e0;
    pcVar1 = ((local_1f0.ptr)->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + ((local_1f0.ptr)->name)._M_string_length);
    local_130 = root;
    local_128 = x;
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_1f0);
    oVar4.ptr = local_1f0.ptr;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    local_230._M_dataplus._M_p = (pointer)0x3d;
    local_210._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)&local_230);
    local_210.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    builtin_strncpy(local_210._M_dataplus._M_p,
                    "\n            <div class=\"content\">\n%s\n            </div>\n    ",0x3d);
    local_210._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_210._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = 0;
    local_188 = 0;
    ppVar5 = ((oVar4.ptr)->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_120 = oVar4.ptr;
    params = ((oVar4.ptr)->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_118 = params;
    if (ppVar5 != params) {
      do {
        if ((ppVar5->second)._M_string_length != 0) {
          local_1b8._0_8_ = &DAT_0000002f;
          local_1e0 = ppVar5;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          local_1d8._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_1d8,(ulong)local_1b8);
          local_1d8.field_2._M_allocated_capacity = local_1b8._0_8_;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1f) = '-';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x20) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x21) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x22) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x23) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x24) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x25) = '\"';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x26) = '>';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x27) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x28) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x29) = '<';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x2a) = '/';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x2b) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x2c) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x2d) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x2e) = '>';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x10) = '<';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x11) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x13) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x14) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x15) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x16) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x18) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x19) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1a) = '=';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1b) = '\"';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1c) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1d) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1e) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0x1f) = '-';
          *(undefined4 *)local_1d8._M_dataplus._M_p = 0x20202020;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 4) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 5) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 6) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 7) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 8) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 9) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 10) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0xb) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0xc) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0xd) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0xe) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p + 0xf) = ' ';
          local_1d8._M_string_length = local_1b8._0_8_;
          local_1d8._M_dataplus._M_p[local_1b8._0_8_] = '\0';
          local_b0._M_allocated_capacity = (size_type)local_a0;
          pcVar1 = (local_1e0->first)._M_dataplus._M_p;
          params = (pointer)local_1b8._0_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + (local_1e0->first)._M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    (&local_230,(StringUtil *)&local_1d8,(string *)&local_b0,&params->first);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     local_198._M_local_buf,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          if ((char *)local_b0._M_allocated_capacity != local_a0) {
            operator_delete((void *)local_b0._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          local_230.field_2._M_allocated_capacity._0_2_ = 10;
          local_230._M_string_length = 1;
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_1b8,&local_1e0->second,&local_230);
          ppVar6 = (pointer)local_1b8._0_8_;
          ppVar5 = (pointer)local_1b8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
            ppVar6 = (pointer)local_1b8._0_8_;
            ppVar5 = (pointer)local_1b8._8_8_;
          }
          for (; ppVar6 != ppVar5; ppVar6 = (pointer)&ppVar6->second) {
            local_158 = local_148;
            local_d0._0_8_ = (pointer)0x2b;
            local_158 = (pointer *)
                        ::std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)local_d0);
            local_148[0] = (pointer)local_d0._0_8_;
            builtin_strncpy((char *)((long)local_158 + 0x1b),"\"value\">",8);
            builtin_strncpy((char *)((long)local_158 + 0x23),"%s</div>",8);
            local_158[2] = (pointer)0x616c63207669643c;
            local_158[3] = (pointer)0x756c6176223d7373;
            *(undefined4 *)local_158 = 0x20202020;
            builtin_strncpy((char *)((long)local_158 + 4),"    ",4);
            *(undefined4 *)(local_158 + 1) = 0x20202020;
            builtin_strncpy((char *)((long)local_158 + 0xc),"    ",4);
            local_150 = (pointer)local_d0._0_8_;
            *(char *)((long)local_158 + local_d0._0_8_) = '\0';
            pcVar1 = (ppVar6->first)._M_dataplus._M_p;
            params = (pointer)local_d0._0_8_;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar1,pcVar1 + (ppVar6->first)._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_230,(StringUtil *)&local_158,&local_70,&params->first);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_198._M_local_buf,&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (local_158 != local_148) {
              operator_delete(local_158);
            }
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
          ppVar5 = local_1e0;
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != local_118);
    }
    local_108 = 0;
    local_100[0] = 0;
    local_110 = local_100;
    if (local_198._M_allocated_capacity != local_198._8_8_) {
      local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,local_210._M_dataplus._M_p,
                 (char *)(local_210._M_string_length + (long)local_210._M_dataplus._M_p));
      local_50.field_2._M_allocated_capacity._0_2_ = 10;
      local_50._M_string_length = 1;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      StringUtil::Join((string *)local_d0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&local_198,&local_50);
      StringUtil::Format<std::__cxx11::string>
                (&local_230,(StringUtil *)local_1b8,(string *)local_d0,&params->first);
      ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    if ((local_120->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_120->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::append((char *)&local_110);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_178._M_allocated_capacity,
               local_178._8_8_ + local_178._M_allocated_capacity);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_230,local_f0,local_f0 + local_e8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_110,local_110 + local_108);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&local_90,(StringUtil *)&local_210,&local_230,&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)y);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    root = local_130;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    x = local_128;
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_178._M_allocated_capacity != local_168) {
    operator_delete((void *)local_178._M_allocated_capacity);
  }
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_90._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  local_230._M_dataplus._M_p = (pointer)RenderTree::GetNode(local_1e8,(idx_t)root,x);
  optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
            ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_230);
  if ((((vector<duckdb::RenderTreeNode::Coordinate,_true> *)(local_230._M_dataplus._M_p + 0x70))->
      super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ).
      super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ._M_impl.super__Vector_impl_data._M_start != *(pointer *)(local_230._M_dataplus._M_p + 0x78))
  {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
              ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_230);
    pCVar7 = (((vector<duckdb::RenderTreeNode::Coordinate,_true> *)
              (local_230._M_dataplus._M_p + 0x70))->
             super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ).
             super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = *(pointer *)(local_230._M_dataplus._M_p + 0x78);
    if (pCVar7 != pCVar2) {
      do {
        CreateTreeRecursive_abi_cxx11_
                  (&local_210,(duckdb *)local_1e8,(RenderTree *)pCVar7->x,pCVar7->y,y);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != pCVar2);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string CreateTreeRecursive(RenderTree &root, idx_t x, idx_t y) {
	string result;

	result += "<li>";
	result += CreateGridItem(root, x, y);
	auto node = root.GetNode(x, y);
	if (!node->child_positions.empty()) {
		result += "<ul class=\"list-inline\">";
		for (auto &coord : node->child_positions) {
			result += CreateTreeRecursive(root, coord.x, coord.y);
		}
		result += "</ul>";
	}
	result += "</li>";
	return result;
}